

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

void __thiscall duckdb::Linenoise::EditSwapCharacter(Linenoise *this)

{
  char *__src;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t __n;
  int iVar5;
  size_t __n_00;
  int iVar6;
  char temp_buffer [128];
  undefined1 local_b8 [136];
  
  if ((this->pos != 0) && (1 < this->len)) {
    if (this->len < this->pos + 1) {
      sVar2 = PrevChar(this);
      this->pos = sVar2;
    }
    sVar3 = PrevChar(this);
    sVar4 = NextChar(this);
    pcVar1 = this->buf;
    sVar2 = this->pos;
    iVar6 = (int)sVar3;
    iVar5 = (int)sVar2;
    __src = pcVar1 + iVar6;
    __n = (size_t)(iVar5 - iVar6);
    switchD_00917c1c::default(local_b8,__src,__n);
    __n_00 = (size_t)((int)sVar4 - iVar5);
    memmove(__src,pcVar1 + sVar2,__n_00);
    switchD_00917c1c::default(this->buf + __n_00 + (long)iVar6,local_b8,__n);
    this->pos = (long)(int)sVar4;
    RefreshLine(this);
  }
  return;
}

Assistant:

void Linenoise::EditSwapCharacter() {
	if (pos == 0 || len < 2) {
		return;
	}
	char temp_buffer[128];
	if (pos + 1 > len) {
		pos = PrevChar();
	}
	int prev_pos = PrevChar();
	int next_pos = NextChar();
	int prev_char_size = pos - prev_pos;
	int cur_char_size = next_pos - pos;
	memcpy(temp_buffer, buf + prev_pos, prev_char_size);
	memmove(buf + prev_pos, buf + pos, cur_char_size);
	memcpy(buf + prev_pos + cur_char_size, temp_buffer, prev_char_size);
	pos = next_pos;
	RefreshLine();
}